

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O3

int spki_table_get_all(spki_table *spki_table,uint32_t asn,uint8_t *ski,spki_record **result,
                      uint *result_size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  spki_record *psVar8;
  long lVar9;
  ulong uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  int iVar13;
  tommy_hashlin_node *ptVar14;
  long in_FS_OFFSET;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  bVar15 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = asn * -0x3f >> 0x11 ^ asn * -0x3f;
  uVar6 = uVar6 * -0x1ff ^ uVar6 * -0x1ff0;
  uVar6 = uVar6 * -7 ^ uVar6 * -0x1c00;
  uVar6 = uVar6 >> 0xf ^ uVar6;
  *result = (spki_record *)0x0;
  *result_size = 0;
  pthread_rwlock_rdlock((pthread_rwlock_t *)&spki_table->lock);
  uVar7 = (spki_table->hashtable).low_mask & uVar6;
  if (uVar7 < (spki_table->hashtable).split) {
    uVar7 = uVar6 & (spki_table->hashtable).bucket_mask;
  }
  uVar6 = 0x1f;
  if ((uVar7 | 1) != 0) {
    for (; (uVar7 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  ptVar14 = (spki_table->hashtable).bucket[uVar6][uVar7];
  iVar13 = 0;
  if (ptVar14 != (tommy_hashlin_node *)0x0) {
    do {
      puVar4 = (uint8_t *)ptVar14->data;
      if (*(uint32_t *)(puVar4 + 0x14) == asn) {
        auVar16[0] = -(*ski == *puVar4);
        auVar16[1] = -(ski[1] == puVar4[1]);
        auVar16[2] = -(ski[2] == puVar4[2]);
        auVar16[3] = -(ski[3] == puVar4[3]);
        auVar16[4] = -(ski[4] == puVar4[4]);
        auVar16[5] = -(ski[5] == puVar4[5]);
        auVar16[6] = -(ski[6] == puVar4[6]);
        auVar16[7] = -(ski[7] == puVar4[7]);
        auVar16[8] = -(ski[8] == puVar4[8]);
        auVar16[9] = -(ski[9] == puVar4[9]);
        auVar16[10] = -(ski[10] == puVar4[10]);
        auVar16[0xb] = -(ski[0xb] == puVar4[0xb]);
        auVar16[0xc] = -(ski[0xc] == puVar4[0xc]);
        auVar16[0xd] = -(ski[0xd] == puVar4[0xd]);
        auVar16[0xe] = -(ski[0xe] == puVar4[0xe]);
        auVar16[0xf] = -(ski[0xf] == puVar4[0xf]);
        uVar1 = *(undefined4 *)(puVar4 + 0x10);
        uVar2 = *(undefined4 *)(ski + 0x10);
        auVar17[0] = -((char)uVar2 == (char)uVar1);
        auVar17[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
        auVar17[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
        auVar17[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
        auVar17[4] = 0xff;
        auVar17[5] = 0xff;
        auVar17[6] = 0xff;
        auVar17[7] = 0xff;
        auVar17[8] = 0xff;
        auVar17[9] = 0xff;
        auVar17[10] = 0xff;
        auVar17[0xb] = 0xff;
        auVar17[0xc] = 0xff;
        auVar17[0xd] = 0xff;
        auVar17[0xe] = 0xff;
        auVar17[0xf] = 0xff;
        auVar17 = auVar17 & auVar16;
        if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
          uVar6 = *result_size;
          *result_size = uVar6 + 1;
          psVar8 = (spki_record *)lrtr_realloc(*result,(ulong)(uVar6 + 1) << 7);
          if (psVar8 == (spki_record *)0x0) {
            lrtr_free(*result);
            iVar13 = -1;
            goto LAB_0010be1c;
          }
          *result = psVar8;
          uVar10 = (ulong)*result_size;
          psVar8[uVar10 - 1].asn = *(uint32_t *)(puVar4 + 0x14);
          psVar8[uVar10 - 1].socket = *(rtr_socket **)(puVar4 + 0x78);
          *(undefined4 *)(psVar8[uVar10 - 1].ski + 0x10) = *(undefined4 *)(puVar4 + 0x10);
          uVar5 = *(undefined8 *)(puVar4 + 8);
          *(undefined8 *)psVar8[uVar10 - 1].ski = *(undefined8 *)puVar4;
          *(undefined8 *)(psVar8[uVar10 - 1].ski + 8) = uVar5;
          puVar11 = puVar4 + 0x18;
          puVar12 = psVar8[uVar10 - 1].spki;
          for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
            *(undefined8 *)puVar12 = *(undefined8 *)puVar11;
            puVar11 = puVar11 + (ulong)bVar15 * -0x10 + 8;
            puVar12 = puVar12 + (ulong)bVar15 * -0x10 + 8;
          }
          *(undefined2 *)(psVar8[uVar10 - 1].spki + 0x58) = *(undefined2 *)(puVar4 + 0x70);
          psVar8[uVar10 - 1].spki[0x5a] = puVar4[0x72];
        }
      }
      ptVar14 = ptVar14->next;
    } while (ptVar14 != (tommy_node_struct *)0x0);
    iVar13 = 0;
  }
LAB_0010be1c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
    return iVar13;
  }
  __stack_chk_fail();
}

Assistant:

int spki_table_get_all(struct spki_table *spki_table, uint32_t asn, uint8_t *ski, struct spki_record **result,
		       unsigned int *result_size)
{
	uint32_t hash = tommy_inthash_u32(asn);
	tommy_node *result_bucket;
	void *tmp;

	*result = NULL;
	*result_size = 0;

	pthread_rwlock_rdlock(&spki_table->lock);

	/**
	 * A tommy node contains its storing key_entry (->data) as well as
	 * next and prev pointer to accommodate multiple results.
	 * The bucket is guaranteed to contain ALL the elements
	 * with the specified hash, but it can contain also others.
	 */
	result_bucket = tommy_hashlin_bucket(&spki_table->hashtable, hash);

	if (!result_bucket) {
		pthread_rwlock_unlock(&spki_table->lock);
		return SPKI_SUCCESS;
	}

	/* Build the result array */
	while (result_bucket) {
		struct key_entry *element;

		element = result_bucket->data;
		if (element->asn == asn && memcmp(element->ski, ski, sizeof(element->ski)) == 0) {
			(*result_size)++;
			tmp = lrtr_realloc(*result, *result_size * sizeof(**result));
			if (!tmp) {
				lrtr_free(*result);
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			*result = tmp;
			key_entry_to_spki_record(element, *result + *result_size - 1);
		}
		result_bucket = result_bucket->next;
	}

	pthread_rwlock_unlock(&spki_table->lock);
	return SPKI_SUCCESS;
}